

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# standardize_data_array.h
# Opt level: O3

vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
* __thiscall
polyscope::
adaptorF_convertArrayOfVectorToStdVectorImpl<glm::vec<3,float,(glm::qualifier)0>,3u,std::vector<geometrycentral::Vector3,std::allocator<geometrycentral::Vector3>>,void>
          (vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
           *__return_storage_ptr__,polyscope *this)

{
  long lVar1;
  pointer pvVar2;
  long lVar3;
  long lVar4;
  size_t j;
  long lVar5;
  pointer pvVar6;
  size_type __n;
  allocator_type local_29;
  
  lVar3 = *(long *)(this + 8);
  lVar4 = *(long *)this;
  __n = (lVar3 - lVar4 >> 3) * -0x5555555555555555;
  std::
  vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
  ::vector(__return_storage_ptr__,__n,&local_29);
  if (lVar3 != lVar4) {
    lVar3 = *(long *)this;
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar4 = 0;
    do {
      lVar5 = 0;
      do {
        pvVar6 = (pointer)&pvVar2[lVar4].field_2;
        if (((int)lVar5 != 2) && (pvVar6 = pvVar2 + lVar4, (int)lVar5 == 1)) {
          pvVar6 = (pointer)&pvVar2[lVar4].field_1;
        }
        lVar1 = lVar5 * 8;
        lVar5 = lVar5 + 1;
        (pvVar6->field_0).x = (float)*(double *)(lVar3 + lVar1);
      } while (lVar5 != 3);
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x18;
    } while (lVar4 != __n + (__n == 0));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<O> adaptorF_convertArrayOfVectorToStdVectorImpl(PreferenceT<6>, const T& inputData) {
  size_t dataSize = adaptorF_size(inputData);
  std::vector<O> dataOut(dataSize);
  for (size_t i = 0; i < dataSize; i++) {
    for (size_t j = 0; j < D; j++) {
      dataOut[i][j] = inputData[i][j];
    }
  }
  return dataOut;
}